

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRegexp.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int local_34;
  int data;
  int i;
  char *filename;
  char *pattern;
  xmlRegexpPtr comp;
  char **argv_local;
  int argc_local;
  
  pattern = (char *)0x0;
  filename = (char *)0x0;
  _data = (char *)0x0;
  xmlInitMemory();
  if (argc < 2) {
    usage(*argv);
    return 1;
  }
  local_34 = 1;
  do {
    if ((argc <= local_34) || (iVar2 = strcmp(argv[local_34],"-"), iVar2 == 0)) break;
    if (*argv[local_34] == '-') {
      iVar2 = strcmp(argv[local_34],"--");
      if (iVar2 == 0) break;
      iVar2 = strcmp(argv[local_34],"-debug");
      if ((iVar2 == 0) || (iVar2 = strcmp(argv[local_34],"--debug"), iVar2 == 0)) {
        debug = debug + 1;
      }
      else {
        iVar2 = strcmp(argv[local_34],"-repeat");
        if ((iVar2 == 0) || (iVar2 = strcmp(argv[local_34],"--repeat"), iVar2 == 0)) {
          repeat = repeat + 1;
        }
        else {
          iVar2 = strcmp(argv[local_34],"-i");
          if (((iVar2 == 0) || (iVar2 = strcmp(argv[local_34],"-f"), iVar2 == 0)) ||
             (iVar2 = strcmp(argv[local_34],"--input"), iVar2 == 0)) {
            local_34 = local_34 + 1;
            _data = argv[local_34];
          }
          else {
            fprintf(_stderr,"Unknown option %s\n",argv[local_34]);
            usage(*argv);
          }
        }
      }
    }
    local_34 = local_34 + 1;
  } while( true );
  if (_data == (char *)0x0) {
    bVar1 = false;
    for (local_34 = 1; local_34 < argc; local_34 = local_34 + 1) {
      iVar2 = strcmp(argv[local_34],"--");
      if (iVar2 == 0) {
        bVar1 = true;
      }
      else if (((*argv[local_34] != '-') || (iVar2 = strcmp(argv[local_34],"-"), iVar2 == 0)) ||
              (bVar1)) {
        if (filename == (char *)0x0) {
          filename = argv[local_34];
          printf("Testing %s:\n",filename);
          pattern = (char *)xmlRegexpCompile(filename);
          if (pattern == (char *)0x0) {
            printf("   failed to compile\n");
            break;
          }
          if (debug != 0) {
            xmlRegexpPrint(_stdout,pattern);
          }
        }
        else {
          testRegexp((xmlRegexpPtr)pattern,argv[local_34]);
        }
      }
    }
    if (pattern != (char *)0x0) {
      xmlRegFreeRegexp(pattern);
    }
  }
  else {
    testRegexpFile(_data);
  }
  xmlCleanupParser();
  xmlMemoryDump();
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    xmlRegexpPtr comp = NULL;
#ifdef LIBXML_EXPR_ENABLED
    xmlExpNodePtr expr = NULL;
    int use_exp = 0;
    xmlExpCtxtPtr ctxt = NULL;
#endif
    const char *pattern = NULL;
    char *filename = NULL;
    int i;

    xmlInitMemory();

    if (argc <= 1) {
	usage(argv[0]);
	return(1);
    }
    for (i = 1; i < argc ; i++) {
	if (!strcmp(argv[i], "-"))
	    break;

	if (argv[i][0] != '-')
	    continue;
	if (!strcmp(argv[i], "--"))
	    break;

	if ((!strcmp(argv[i], "-debug")) || (!strcmp(argv[i], "--debug"))) {
	    debug++;
	} else if ((!strcmp(argv[i], "-repeat")) ||
	         (!strcmp(argv[i], "--repeat"))) {
	    repeat++;
#ifdef LIBXML_EXPR_ENABLED
	} else if ((!strcmp(argv[i], "-expr")) ||
	         (!strcmp(argv[i], "--expr"))) {
	    use_exp++;
#endif
	} else if ((!strcmp(argv[i], "-i")) || (!strcmp(argv[i], "-f")) ||
		   (!strcmp(argv[i], "--input")))
	    filename = argv[++i];
        else {
	    fprintf(stderr, "Unknown option %s\n", argv[i]);
	    usage(argv[0]);
	}
    }

#ifdef LIBXML_EXPR_ENABLED
    if (use_exp)
	ctxt = xmlExpNewCtxt(0, NULL);
#endif

    if (filename != NULL) {
#ifdef LIBXML_EXPR_ENABLED
        if (use_exp)
	    runFileTest(ctxt, filename);
	else
#endif
	    testRegexpFile(filename);
    } else {
        int  data = 0;
#ifdef LIBXML_EXPR_ENABLED

        if (use_exp) {
	    for (i = 1; i < argc ; i++) {
	        if (strcmp(argv[i], "--") == 0)
		    data = 1;
		else if ((argv[i][0] != '-') || (strcmp(argv[i], "-") == 0) ||
		    (data == 1)) {
		    if (pattern == NULL) {
			pattern = argv[i];
			printf("Testing expr %s:\n", pattern);
			expr = xmlExpParse(ctxt, pattern);
			if (expr == NULL) {
			    printf("   failed to compile\n");
			    break;
			}
			if (debug) {
			    exprDebug(ctxt, expr);
			}
		    } else {
			testReduce(ctxt, expr, argv[i]);
		    }
		}
	    }
	    if (expr != NULL) {
		xmlExpFree(ctxt, expr);
		expr = NULL;
	    }
	} else
#endif
        {
	    for (i = 1; i < argc ; i++) {
	        if (strcmp(argv[i], "--") == 0)
		    data = 1;
		else if ((argv[i][0] != '-') || (strcmp(argv[i], "-") == 0) ||
		         (data == 1)) {
		    if (pattern == NULL) {
			pattern = argv[i];
			printf("Testing %s:\n", pattern);
			comp = xmlRegexpCompile((const xmlChar *) pattern);
			if (comp == NULL) {
			    printf("   failed to compile\n");
			    break;
			}
			if (debug)
			    xmlRegexpPrint(stdout, comp);
		    } else {
			testRegexp(comp, argv[i]);
		    }
		}
	    }
	    if (comp != NULL)
		xmlRegFreeRegexp(comp);
        }
    }
#ifdef LIBXML_EXPR_ENABLED
    if (ctxt != NULL) {
	printf("Ops: %d nodes, %d cons\n",
	       xmlExpCtxtNbNodes(ctxt), xmlExpCtxtNbCons(ctxt));
	xmlExpFreeCtxt(ctxt);
    }
#endif
    xmlCleanupParser();
    xmlMemoryDump();
    return(0);
}